

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall despot::BaseTag::PrintAction(BaseTag *this)

{
  ostream *poVar1;
  long lVar2;
  ostream *in_RDX;
  undefined4 in_ESI;
  char *pcVar3;
  
  switch(in_ESI) {
  case 0:
    pcVar3 = "North";
    break;
  case 1:
    pcVar3 = "East";
    goto LAB_0011185e;
  case 2:
    pcVar3 = "South";
    break;
  case 3:
    pcVar3 = "West";
LAB_0011185e:
    lVar2 = 4;
    goto LAB_00111863;
  case 4:
    pcVar3 = "Tag";
    lVar2 = 3;
    goto LAB_00111863;
  default:
    poVar1 = std::operator<<(in_RDX,"Wrong action");
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(1);
  }
  lVar2 = 5;
LAB_00111863:
  std::__ostream_insert<char,std::char_traits<char>>(in_RDX,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)in_RDX + -0x18) + (char)in_RDX);
  std::ostream::put((char)in_RDX);
  std::ostream::flush();
  return;
}

Assistant:

void BaseTag::PrintAction(ACT_TYPE action, ostream& out) const {
	switch(action) {
		case 0: out << "North" << endl; break;
		case 1: out << "East" << endl; break;
		case 2: out << "South" << endl; break;
		case 3: out << "West" << endl; break;
		case 4: out << "Tag" << endl; break;
		default: out << "Wrong action" << endl; exit(1);
	}
}